

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O0

void RC2_set_key(RC2_KEY *key,int len,uchar *data,int bits)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint d;
  uint c;
  uint16_t *ki;
  uint8_t *k;
  int local_28;
  int j;
  int i;
  int bits_local;
  uint8_t *data_local;
  int len_local;
  RC2_KEY *key_local;
  
  *(undefined1 *)key->data = 0;
  data_local._4_4_ = len;
  if (0x80 < len) {
    data_local._4_4_ = 0x80;
  }
  j = bits;
  if (bits < 1) {
    j = 0x400;
  }
  if (0x400 < j) {
    j = 0x400;
  }
  for (local_28 = 0; local_28 < data_local._4_4_; local_28 = local_28 + 1) {
    *(uchar *)((long)key->data + (long)local_28) = data[local_28];
  }
  uVar1 = *(uint8_t *)((long)key->data + (long)(data_local._4_4_ + -1));
  k._4_4_ = 0;
  for (local_28 = data_local._4_4_; local_28 < 0x80; local_28 = local_28 + 1) {
    uVar1 = key_table[(byte)(*(char *)((long)key->data + (long)k._4_4_) + uVar1)];
    *(uint8_t *)((long)key->data + (long)local_28) = uVar1;
    k._4_4_ = k._4_4_ + 1;
  }
  iVar3 = j + 7 >> 3;
  local_28 = 0x80 - iVar3;
  bVar2 = key_table[(uint)*(byte *)((long)key->data + (long)local_28) & 0xff >> (-(char)j & 7U)];
  *(byte *)((long)key->data + (long)local_28) = bVar2;
  while (iVar4 = local_28 + -1, local_28 != 0) {
    bVar2 = key_table[*(byte *)((long)key->data + (long)(iVar4 + iVar3)) ^ bVar2];
    *(byte *)((long)key->data + (long)iVar4) = bVar2;
    local_28 = iVar4;
  }
  _d = (undefined2 *)((long)key->data + 0x7e);
  for (local_28 = 0x7f; -1 < local_28; local_28 = local_28 + -2) {
    *_d = CONCAT11(*(undefined1 *)((long)key->data + (long)local_28),
                   *(undefined1 *)((long)key->data + (long)(local_28 + -1)));
    _d = _d + -1;
  }
  return;
}

Assistant:

static void RC2_set_key(RC2_KEY *key, int len, const uint8_t *data, int bits) {
  int i, j;
  uint8_t *k;
  uint16_t *ki;
  unsigned int c, d;

  k = (uint8_t *)&key->data[0];
  *k = 0;  // for if there is a zero length key

  if (len > 128) {
    len = 128;
  }
  if (bits <= 0) {
    bits = 1024;
  }
  if (bits > 1024) {
    bits = 1024;
  }

  for (i = 0; i < len; i++) {
    k[i] = data[i];
  }

  // expand table
  d = k[len - 1];
  j = 0;
  for (i = len; i < 128; i++, j++) {
    d = key_table[(k[j] + d) & 0xff];
    k[i] = d;
  }

  // hmm.... key reduction to 'bits' bits

  j = (bits + 7) >> 3;
  i = 128 - j;
  c = (0xff >> (-bits & 0x07));

  d = key_table[k[i] & c];
  k[i] = d;
  while (i--) {
    d = key_table[k[i + j] ^ d];
    k[i] = d;
  }

  // copy from bytes into uint16_t's
  ki = &(key->data[63]);
  for (i = 127; i >= 0; i -= 2) {
    *(ki--) = ((k[i] << 8) | k[i - 1]) & 0xffff;
  }
}